

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMD.cpp
# Opt level: O2

void __thiscall Storage::Disk::IMD::IMD(IMD *this,string *file_name)

{
  FileHolder *this_00;
  _Rb_tree_header *p_Var1;
  undefined1 uVar2;
  bool bVar3;
  uint8_t uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  undefined4 *puVar10;
  uint uVar11;
  long offset;
  int iVar12;
  ulong offset_00;
  Address local_40;
  long location;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__IMD_0058e5f8;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  p_Var1 = &(this->track_locations_)._M_t._M_impl.super__Rb_tree_header;
  (this->track_locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->track_locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->track_locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->track_locations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->track_locations_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cylinders_ = '\0';
  this->heads_ = '\0';
  bVar3 = FileHolder::check_signature(this_00,"IMD",0);
  if (!bVar3) {
    puVar10 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar10 = 0xfffffffe;
    __cxa_throw(puVar10,&Error::typeinfo,0);
  }
  do {
    uVar4 = FileHolder::get8(this_00);
  } while (uVar4 != '\x1a');
LAB_003d650a:
  location = FileHolder::tell(this_00);
  FileHolder::seek(this_00,1,1);
  bVar5 = FileHolder::get8(this_00);
  bVar6 = FileHolder::get8(this_00);
  bVar7 = FileHolder::get8(this_00);
  bVar8 = FileHolder::get8(this_00);
  bVar3 = FileHolder::eof(this_00);
  if (bVar3) {
    this->cylinders_ = this->cylinders_ + '\x01';
    this->heads_ = this->heads_ + '\x01';
    return;
  }
  uVar2 = this->cylinders_;
  bVar9 = uVar2;
  if ((byte)uVar2 < bVar5) {
    bVar9 = bVar5;
  }
  this->cylinders_ = bVar9;
  local_40.head = bVar6 & 1;
  uVar11 = (uint)this->heads_;
  if (this->heads_ <= (byte)local_40.head) {
    uVar11 = local_40.head;
  }
  this->heads_ = (uint8_t)uVar11;
  local_40.position.position_ = (uint)bVar5 << 2;
  std::
  _Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,long>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,long>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,long>>>
  ::_M_emplace_unique<Storage::Disk::Track::Address,long_const&>
            ((_Rb_tree<Storage::Disk::Track::Address,std::pair<Storage::Disk::Track::Address_const,long>,std::_Select1st<std::pair<Storage::Disk::Track::Address_const,long>>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,long>>>
              *)&this->track_locations_,&local_40,&location);
  offset_00 = (ulong)bVar7;
  FileHolder::seek(this_00,offset_00,1);
  if ((char)bVar6 < '\0') {
    FileHolder::seek(this_00,offset_00,1);
  }
  if ((bVar6 & 0x40) != 0) {
    FileHolder::seek(this_00,offset_00,1);
  }
LAB_003d65f7:
  do {
    iVar12 = (int)offset_00;
    offset_00 = (ulong)(iVar12 - 1);
    if (iVar12 == 0) goto LAB_003d650a;
    bVar5 = FileHolder::get8(this_00);
    if (bVar5 < 9) {
      offset = (long)(0x80 << (bVar8 & 0x1f));
      if ((0xaaU >> (bVar5 & 0x1f) & 1) == 0) {
        if ((0x154U >> (bVar5 & 0x1f) & 1) == 0) goto LAB_003d65f7;
        offset = 1;
      }
      FileHolder::seek(this_00,offset,1);
    }
  } while( true );
}

Assistant:

IMD::IMD(const std::string &file_name) : file_(file_name) {
	// Check for signature.
	if(!file_.check_signature("IMD")) {
		throw Error::InvalidFormat;
	}

	// Skip rest of ASCII.
	while(file_.get8() != 0x1a);

	// Build track map.
	while(true) {
		const auto location = file_.tell();

		// Skip mode.
		file_.seek(1, SEEK_CUR);

		// Grab relevant fields.
		const uint8_t cylinder = file_.get8();
		const uint8_t head = file_.get8();
		const uint8_t sector_count = file_.get8();
		const uint8_t sector_size = file_.get8();
		if(file_.eof()) {
			break;
		}

		cylinders_ = std::max(cylinder, cylinders_);
		heads_ = std::max(uint8_t(head & 1), heads_);

		// Update head and cylinder extents, record sector location for later.
		track_locations_.emplace(
			Storage::Disk::Track::Address(head & 1, HeadPosition(cylinder)),
			location);

		// Skip sector numbers.
		file_.seek(sector_count, SEEK_CUR);

		// Skip cylinder map.
		if(head & 0x80) {
			file_.seek(sector_count, SEEK_CUR);
		}

		// Skip head map.
		if(head & 0x40) {
			file_.seek(sector_count, SEEK_CUR);
		}

		// Skip sectors.
		for(int c = 0; c < sector_count; c++) {
			const uint8_t type = file_.get8();
			switch(type) {
				case 0x00:	break;	// Sector couldn't be read.

				// Types with all sector data present.
				case 0x01:	case 0x03:	case 0x05:	case 0x07:
					file_.seek(128 << sector_size, SEEK_CUR);
				break;

				// Types with a single byte present.
				case 0x02:	case 0x04:	case 0x06:	case 0x08:
					file_.seek(1, SEEK_CUR);
				break;
			}
		}
	}

	// Both heads_ and cylinders_ are now the maximum observed IDs, which
	// are one less than the counts.
	++ cylinders_;
	++ heads_;
}